

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

int fy_node_mapping_append(fy_node *fyn_map,fy_node *fyn_key,fy_node *fyn_value)

{
  list_head *plVar1;
  int iVar2;
  fy_node_pair *value;
  fy_node *pfVar3;
  
  value = fy_node_mapping_pair_insert_prepare(fyn_map,fyn_key,fyn_value);
  if (value == (fy_node_pair *)0x0) {
    iVar2 = -1;
  }
  else {
    plVar1 = (fyn_map->field_12).sequence._lh.prev;
    (fyn_map->field_12).sequence._lh.prev = &value->node;
    (value->node).next = (list_head *)&fyn_map->field_12;
    (value->node).prev = plVar1;
    plVar1->next = &value->node;
    if (fyn_map->xl != (fy_accel *)0x0) {
      fy_accel_insert(fyn_map->xl,fyn_key,value);
    }
    if (fyn_key != (fy_node *)0x0) {
      fyn_key->field_0x34 = fyn_key->field_0x34 | 8;
    }
    if (fyn_value != (fy_node *)0x0) {
      fyn_value->field_0x34 = fyn_value->field_0x34 | 8;
    }
    fyn_map->field_0x34 = fyn_map->field_0x34 | 0x10;
    iVar2 = 0;
    for (pfVar3 = fyn_map->parent; pfVar3 != (fy_node *)0x0; pfVar3 = pfVar3->parent) {
      pfVar3->field_0x34 = pfVar3->field_0x34 | 0x10;
    }
  }
  return iVar2;
}

Assistant:

int fy_node_mapping_append(struct fy_node *fyn_map,
                           struct fy_node *fyn_key, struct fy_node *fyn_value) {
    struct fy_node_pair *fynp;

    fynp = fy_node_mapping_pair_insert_prepare(fyn_map, fyn_key, fyn_value);
    if (!fynp)
        return -1;

    fy_node_pair_list_add_tail(&fyn_map->mapping, fynp);
    if (fyn_map->xl)
        fy_accel_insert(fyn_map->xl, fyn_key, fynp);

    if (fyn_key)
        fyn_key->attached = true;
    if (fyn_value)
        fyn_value->attached = true;

    fy_node_mark_synthetic(fyn_map);

    return 0;
}